

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O1

shared_ptr<libtorrent::peer_plugin> __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::new_connection
          (ut_metadata_plugin *this,peer_connection_handle *pc)

{
  unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  *puVar1;
  int iVar2;
  uint uVar3;
  connection_type cVar4;
  int iVar5;
  peer_connection_handle *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  bool bVar9;
  shared_ptr<libtorrent::peer_plugin> sVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  cVar4 = peer_connection_handle::type(in_RDX);
  if (cVar4 == bittorrent) {
    p_Var7 = (in_RDX->m_connection).
             super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar5 = p_Var7->_M_use_count;
      do {
        if (iVar5 == 0) {
          p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar2 = p_Var7->_M_use_count;
        bVar9 = iVar5 == iVar2;
        if (bVar9) {
          p_Var7->_M_use_count = iVar5 + 1;
          iVar2 = iVar5;
        }
        iVar5 = iVar2;
        UNLOCK();
      } while (!bVar9);
    }
    if (p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar9 = true;
    }
    else {
      bVar9 = p_Var7->_M_use_count == 0;
    }
    if (bVar9) {
      peVar8 = (element_type *)0x0;
    }
    else {
      peVar8 = (in_RDX->m_connection).
               super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
    }
    if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    p_Var7 = (pc->m_connection).
             super___weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl =
         (piece_picker *)0x100000001;
    (((torrent *)local_28._M_pi)->super_request_callback)._vptr_request_callback =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_004f8b88;
    puVar1 = &(((torrent *)local_28._M_pi)->super_torrent_hot_members).m_hash_picker;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_torrent_file.
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_torrent_file.
    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_hash_picker._M_t.
    super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
    .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl =
         (hash_picker *)&PTR__ut_metadata_peer_plugin_004f8bd8;
    *(undefined4 *)&(((torrent *)local_28._M_pi)->super_torrent_hot_members).m_size_on_disk = 0;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_ses =
         (session_interface *)0x8000000000000000;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_connections.
    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    .
    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined8 *)&(((torrent *)local_28._M_pi)->super_torrent_hot_members).field_0x48 = 0;
    (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_peer_list._M_t.
    super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
    ._M_t.
    super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
    .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl = (peer_list *)0x0;
    (((torrent *)local_28._M_pi)->super_peer_class_set).m_size = '\0';
    *(undefined3 *)&(((torrent *)local_28._M_pi)->super_peer_class_set).field_0x1 = 0;
    (((torrent *)local_28._M_pi)->super_peer_class_set).m_class.
    super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
    ._M_elems[0] = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     ((((torrent *)local_28._M_pi)->super_peer_class_set).m_class.
      super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
      ._M_elems + 1) = p_Var7;
    *(element_type **)
     ((((torrent *)local_28._M_pi)->super_peer_class_set).m_class.
      super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
      ._M_elems + 3) = peVar8;
    *(peer_connection_handle **)
     ((((torrent *)local_28._M_pi)->super_peer_class_set).m_class.
      super_array<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>,_15UL>
      ._M_elems + 5) = pc;
    p_Var7 = (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if ((p_Var7 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (uVar3 = p_Var7->_M_use_count,
       _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar3, uVar3 == 0)) {
      (((torrent *)local_28._M_pi)->super_torrent_hot_members).m_torrent_file.
      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)puVar1;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                 &(((torrent *)local_28._M_pi)->super_torrent_hot_members).m_torrent_file.
                  super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_28);
      _Var6._M_pi = extraout_RDX_00;
    }
    (this->super_torrent_plugin)._vptr_torrent_plugin = (_func_int **)puVar1;
    this->m_torrent = (torrent *)0x0;
    this->m_torrent = (torrent *)local_28._M_pi;
  }
  else {
    (this->super_torrent_plugin)._vptr_torrent_plugin = (_func_int **)0x0;
    this->m_torrent = (torrent *)0x0;
    _Var6._M_pi = extraout_RDX;
  }
  sVar10.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar10.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::peer_plugin>)
         sVar10.super___shared_ptr<libtorrent::peer_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<peer_plugin> ut_metadata_plugin::new_connection(
		peer_connection_handle const& pc)
	{
		if (pc.type() != connection_type::bittorrent) return {};

		aux::bt_peer_connection* c = static_cast<aux::bt_peer_connection*>(pc.native_handle().get());
		return std::make_shared<ut_metadata_peer_plugin>(m_torrent, *c, *this);
	}